

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O2

Abc_Ntk_t *
Abc_NtkSpeedup(Abc_Ntk_t *pNtk,int fUseLutLib,int Percentage,int Degree,int fVerbose,
              int fVeryVerbose)

{
  float *pfVar1;
  Abc_NtkFunc_t AVar2;
  uint uVar3;
  void *__ptr;
  Abc_Obj_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  Abc_Ntk_t *p;
  Abc_Ntk_t *p_00;
  long *plVar6;
  long *plVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  char *pcVar11;
  Abc_Ntk_t *pAVar12;
  uint uVar13;
  Abc_Ntk_t *pNtk_00;
  ulong uVar14;
  int iVar15;
  long lVar16;
  float fVar17;
  float tDelta;
  uint local_64;
  int local_4c;
  
  fVar17 = Abc_NtkDelayTraceLut(pNtk,fUseLutLib);
  if (fUseLutLib == 0) {
    tDelta = 1.0;
  }
  else {
    tDelta = ((float)Percentage * fVar17) / 100.0;
  }
  if (fVerbose != 0) {
    printf("Max delay = %.2f. Delta = %.2f. ",(double)fVar17,(double)tDelta);
    pcVar11 = "LUT library";
    if (fUseLutLib == 0) {
      pcVar11 = "unit-delay";
    }
    printf("Using %s model. ",pcVar11);
    if (fUseLutLib != 0) {
      printf("Percentage = %d. ",(ulong)(uint)Percentage);
    }
    putchar(10);
  }
  uVar14 = (ulong)pNtk->vObjs->nSize;
  __ptr = calloc(1,uVar14 << 2);
  for (iVar10 = 0; iVar10 < (int)uVar14; iVar10 = iVar10 + 1) {
    pAVar5 = pNtk;
    pAVar4 = Abc_NtkObj(pNtk,iVar10);
    if (((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) &&
       (pAVar4->pNtk->pLutTimes[(long)pAVar4->Id * 3 + 2] < tDelta)) {
      uVar3 = Abc_NtkDelayTraceTCEdges(pAVar5,pAVar4,tDelta,fUseLutLib);
      *(uint *)((long)__ptr + (long)pAVar4->Id * 4) = uVar3;
    }
    uVar14 = (ulong)(uint)pNtk->vObjs->nSize;
  }
  if (fVerbose != 0) {
    uVar3 = 0;
    iVar10 = 0;
    for (iVar15 = 0; iVar15 < (int)uVar14; iVar15 = iVar15 + 1) {
      pAVar4 = Abc_NtkObj(pNtk,iVar15);
      if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
        uVar13 = (pAVar4->vFanins).nSize;
        uVar14 = (ulong)uVar13;
        if ((int)uVar13 < 1) {
          uVar14 = 0;
        }
        for (uVar8 = 0; uVar14 != uVar8; uVar8 = uVar8 + 1) {
          plVar6 = (long *)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[uVar8]];
          uVar13 = *(uint *)((long)plVar6 + 0x14) & 0xf;
          if (((uVar13 != 2) && (uVar13 != 5)) &&
             (pfVar1 = (float *)(*(long *)(*plVar6 + 400) + 8 + (long)(int)plVar6[2] * 0xc),
             *pfVar1 <= tDelta && tDelta != *pfVar1)) {
            uVar3 = uVar3 + 1;
          }
        }
        uVar13 = *(uint *)((long)__ptr + (long)pAVar4->Id * 4);
        uVar13 = (uVar13 >> 1 & 0x55555555) + (uVar13 & 0x55555555);
        uVar13 = (uVar13 >> 2 & 0x33333333) + (uVar13 & 0x33333333);
        uVar13 = (uVar13 >> 4 & 0x7070707) + (uVar13 & 0x7070707);
        uVar13 = (uVar13 >> 8 & 0xf000f) + (uVar13 & 0xf000f);
        iVar10 = (uVar13 >> 0x10) + iVar10 + (uVar13 & 0xffff);
      }
      uVar14 = (ulong)(uint)pNtk->vObjs->nSize;
    }
    uVar13 = Abc_NtkGetTotalFanins(pNtk);
    printf("Edges: Total = %7d. 0-slack = %7d. Critical = %7d. Ratio = %4.2f\n",
           (double)iVar10 / (double)(int)uVar3,(ulong)uVar13,(ulong)uVar3);
  }
  pAVar5 = Abc_NtkStrash(pNtk,0,1,0);
  p = (Abc_Ntk_t *)Vec_PtrAlloc(0x10);
  p_00 = (Abc_Ntk_t *)Vec_PtrAlloc(0x10);
  local_64 = 0;
  local_4c = 0;
  for (iVar10 = 0; iVar10 < pNtk->vObjs->nSize; iVar10 = iVar10 + 1) {
    pAVar4 = Abc_NtkObj(pNtk,iVar10);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
      if (pAVar4->pNtk->pLutTimes[(long)pAVar4->Id * 3 + 2] < tDelta) {
        uVar3 = (pAVar4->vFanins).nSize;
        pAVar12 = (Abc_Ntk_t *)0x0;
        pNtk_00 = (Abc_Ntk_t *)0x0;
        if (0 < (int)uVar3) {
          pNtk_00 = (Abc_Ntk_t *)(ulong)uVar3;
        }
        uVar14 = 0;
        for (; iVar15 = (int)uVar14, pNtk_00 != pAVar12;
            pAVar12 = (Abc_Ntk_t *)((long)&pAVar12->ntkType + 1)) {
          uVar13 = *(uint *)((long)pAVar4->pNtk->vObjs->pArray
                                   [(pAVar4->vFanins).pArray[(long)pAVar12]] + 0x14) & 0xf;
          if ((uVar13 != 2) && (uVar13 != 5)) {
            uVar14 = (ulong)(iVar15 + (uint)((*(uint *)((long)__ptr + (long)pAVar4->Id * 4) >>
                                              ((uint)pAVar12 & 0x1f) & 1) != 0));
          }
        }
        if (fVeryVerbose != 0 || iVar15 != 0) {
          local_64 = local_64 + 1;
          p->ntkFunc = ABC_FUNC_NONE;
          if (iVar15 != 0) {
            for (lVar16 = 0; lVar16 < (int)uVar3; lVar16 = lVar16 + 1) {
              plVar6 = (long *)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar16]];
              uVar13 = *(uint *)((long)plVar6 + 0x14) & 0xf;
              if (((uVar13 != 2) && (uVar13 != 5)) &&
                 ((*(uint *)((long)__ptr + (long)pAVar4->Id * 4) >> ((uint)lVar16 & 0x1f) & 1) != 0)
                 ) {
                for (lVar9 = 0; lVar9 < *(int *)((long)plVar6 + 0x1c); lVar9 = lVar9 + 1) {
                  if ((*(uint *)((long)__ptr + (long)(int)plVar6[2] * 4) >> ((uint)lVar9 & 0x1f) & 1
                      ) != 0) {
                    pNtk_00 = p;
                    Vec_PtrPushUnique((Vec_Ptr_t *)p,
                                      *(void **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                                (long)*(int *)(plVar6[4] + lVar9 * 4) * 8));
                  }
                }
                uVar3 = (pAVar4->vFanins).nSize;
              }
            }
            AVar2 = p->ntkFunc;
            if ((int)AVar2 <= Degree && AVar2 != ABC_FUNC_NONE) {
              p_00->ntkFunc = ABC_FUNC_NONE;
              for (lVar16 = 0; lVar16 < (int)uVar3; lVar16 = lVar16 + 1) {
                plVar6 = (long *)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar16]];
                uVar3 = *(uint *)((long)plVar6 + 0x14) & 0xf;
                if ((uVar3 == 2) || (uVar3 == 5)) {
                  pNtk_00 = p_00;
                  Vec_PtrPushUnique((Vec_Ptr_t *)p_00,plVar6);
                }
                else {
                  for (lVar9 = 0; lVar9 < *(int *)((long)plVar6 + 0x1c); lVar9 = lVar9 + 1) {
                    pNtk_00 = p_00;
                    Vec_PtrPushUnique((Vec_Ptr_t *)p_00,
                                      *(void **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                                (long)*(int *)(plVar6[4] + lVar9 * 4) * 8));
                  }
                }
                uVar3 = (pAVar4->vFanins).nSize;
              }
              if (fVeryVerbose != 0) {
                printf("%5d Node %5d : %d %2d %2d  ",(ulong)local_64,(ulong)(uint)pAVar4->Id,uVar14,
                       (ulong)AVar2,(ulong)p_00->ntkFunc);
                for (lVar16 = 0; lVar16 < (pAVar4->vFanins).nSize; lVar16 = lVar16 + 1) {
                  plVar6 = (long *)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar16]];
                  lVar9 = (long)(int)plVar6[2];
                  pcVar11 = "*";
                  if ((*(uint *)((long)__ptr + (long)pAVar4->Id * 4) >> ((uint)lVar16 & 0x1f) & 1)
                      == 0) {
                    pcVar11 = "";
                  }
                  printf("%d(%.2f)%s ",
                         (double)*(float *)(*(long *)(*plVar6 + 400) + 8 + lVar9 * 0xc),lVar9,
                         pcVar11);
                }
                pNtk_00 = (Abc_Ntk_t *)0xa;
                putchar(10);
              }
              if (1 < (int)AVar2) {
                plVar6 = (long *)Vec_PtrEntry((Vec_Ptr_t *)p,0);
                plVar7 = (long *)Vec_PtrEntry((Vec_Ptr_t *)p,1);
                pNtk_00 = (Abc_Ntk_t *)((long)(int)plVar7[2] * 0xc);
                fVar17 = *(float *)((long)pNtk_00->nObjCounts + *(long *)(*plVar7 + 400) + -0x58);
                pfVar1 = (float *)(*(long *)(*plVar6 + 400) + 8 + (long)(int)plVar6[2] * 0xc);
                if (*pfVar1 <= fVar17 && fVar17 != *pfVar1) {
                  Vec_PtrWriteEntry((Vec_Ptr_t *)p,0,plVar7);
                  pNtk_00 = p;
                  Vec_PtrWriteEntry((Vec_Ptr_t *)p,1,plVar6);
                }
                if (AVar2 != ABC_FUNC_BDD) {
                  plVar6 = (long *)Vec_PtrEntry((Vec_Ptr_t *)p,1);
                  plVar7 = (long *)Vec_PtrEntry((Vec_Ptr_t *)p,2);
                  fVar17 = *(float *)(*(long *)(*plVar7 + 400) + 8 + (long)(int)plVar7[2] * 0xc);
                  pfVar1 = (float *)(*(long *)(*plVar6 + 400) + 8 + (long)(int)plVar6[2] * 0xc);
                  if (*pfVar1 <= fVar17 && fVar17 != *pfVar1) {
                    Vec_PtrWriteEntry((Vec_Ptr_t *)p,1,plVar7);
                    Vec_PtrWriteEntry((Vec_Ptr_t *)p,2,plVar6);
                  }
                  plVar6 = (long *)Vec_PtrEntry((Vec_Ptr_t *)p,0);
                  plVar7 = (long *)Vec_PtrEntry((Vec_Ptr_t *)p,1);
                  pNtk_00 = (Abc_Ntk_t *)((long)(int)plVar7[2] * 0xc);
                  fVar17 = *(float *)((long)pNtk_00->nObjCounts + *(long *)(*plVar7 + 400) + -0x58);
                  pfVar1 = (float *)(*(long *)(*plVar6 + 400) + 8 + (long)(int)plVar6[2] * 0xc);
                  if (*pfVar1 <= fVar17 && fVar17 != *pfVar1) {
                    Vec_PtrWriteEntry((Vec_Ptr_t *)p,0,plVar7);
                    pNtk_00 = p;
                    Vec_PtrWriteEntry((Vec_Ptr_t *)p,1,plVar6);
                  }
                }
              }
              local_4c = local_4c + 1;
              Abc_NtkSpeedupNode(pNtk_00,pAVar5,pAVar4,(Vec_Ptr_t *)p_00,(Vec_Ptr_t *)p);
            }
          }
        }
      }
    }
  }
  Vec_PtrFree((Vec_Ptr_t *)p);
  Vec_PtrFree((Vec_Ptr_t *)p_00);
  free(__ptr);
  if (fVerbose != 0) {
    printf("Nodes: Total = %7d. 0-slack = %7d. Workable = %7d. Ratio = %4.2f\n",
           (double)local_4c / (double)(int)local_64,(ulong)(uint)pNtk->nObjCounts[7]);
  }
  for (iVar10 = 0; iVar10 < pAVar5->vObjs->nSize; iVar10 = iVar10 + 1) {
    pAVar4 = Abc_NtkObj(pAVar5,iVar10);
    if (((pAVar4 != (Abc_Obj_t *)0x0) && (iVar15 = Abc_AigNodeIsAnd(pAVar4), iVar15 != 0)) &&
       (((pAVar4->field_5).pData != (void *)0x0 &&
        (0 < *(int *)((long)(pAVar4->field_5).pData + 0x2c))))) {
      (pAVar4->field_5).pData = (void *)0x0;
    }
  }
  return pAVar5;
}

Assistant:

Abc_Ntk_t * Abc_NtkSpeedup( Abc_Ntk_t * pNtk, int fUseLutLib, int Percentage, int Degree, int fVerbose, int fVeryVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Vec_Ptr_t * vTimeCries, * vTimeFanins;
    Abc_Obj_t * pNode, * pFanin, * pFanin2;
    float tDelta, tArrival;
    int i, k, k2, Counter, CounterRes, nTimeCris;
    unsigned * puTCEdges;
    // perform delay trace
    tArrival = Abc_NtkDelayTraceLut( pNtk, fUseLutLib );
    tDelta = fUseLutLib ? tArrival*Percentage/100.0 : 1.0;
    if ( fVerbose )
    {
        printf( "Max delay = %.2f. Delta = %.2f. ", tArrival, tDelta );
        printf( "Using %s model. ", fUseLutLib? "LUT library" : "unit-delay" );
        if ( fUseLutLib )
            printf( "Percentage = %d. ", Percentage );
        printf( "\n" );
    }
    // mark the timing critical nodes and edges
    puTCEdges = ABC_ALLOC( unsigned, Abc_NtkObjNumMax(pNtk) );
    memset( puTCEdges, 0, sizeof(unsigned) * Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjSlack(pNode) >= tDelta )
            continue;
        puTCEdges[pNode->Id] = Abc_NtkDelayTraceTCEdges( pNtk, pNode, tDelta, fUseLutLib );
    }
    if ( fVerbose )
    {
        Counter = CounterRes = 0;
        Abc_NtkForEachNode( pNtk, pNode, i )
        {
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( !Abc_ObjIsCi(pFanin) && Abc_ObjSlack(pFanin) < tDelta )
                    Counter++;
            CounterRes += Extra_WordCountOnes( puTCEdges[pNode->Id] );
        }
        printf( "Edges: Total = %7d. 0-slack = %7d. Critical = %7d. Ratio = %4.2f\n", 
            Abc_NtkGetTotalFanins(pNtk), Counter, CounterRes, 1.0*CounterRes/Counter );
    }
    // start the resulting network
    pNtkNew = Abc_NtkStrash( pNtk, 0, 1, 0 );

    // collect nodes to be used for resynthesis
    Counter = CounterRes = 0;
    vTimeCries = Vec_PtrAlloc( 16 );
    vTimeFanins = Vec_PtrAlloc( 16 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjSlack(pNode) >= tDelta )
            continue;
        // count the number of non-PI timing-critical nodes
        nTimeCris = 0;
        Abc_ObjForEachFanin( pNode, pFanin, k )
            if ( !Abc_ObjIsCi(pFanin) && (puTCEdges[pNode->Id] & (1<<k)) )
                nTimeCris++;
        if ( !fVeryVerbose && nTimeCris == 0 )
            continue;
        Counter++;
        // count the total number of timing critical second-generation nodes
        Vec_PtrClear( vTimeCries );
        if ( nTimeCris )
        {
            Abc_ObjForEachFanin( pNode, pFanin, k )
                if ( !Abc_ObjIsCi(pFanin) && (puTCEdges[pNode->Id] & (1<<k)) )
                    Abc_ObjForEachFanin( pFanin, pFanin2, k2 )
                        if ( puTCEdges[pFanin->Id] & (1<<k2) )
                            Vec_PtrPushUnique( vTimeCries, pFanin2 );
        }
//        if ( !fVeryVerbose && (Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree) )
        if ( (Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree) )
            continue;
        CounterRes++;
        // collect second generation nodes
        Vec_PtrClear( vTimeFanins );
        Abc_ObjForEachFanin( pNode, pFanin, k )
        {
            if ( Abc_ObjIsCi(pFanin) )
                Vec_PtrPushUnique( vTimeFanins, pFanin );
            else
                Abc_ObjForEachFanin( pFanin, pFanin2, k2 )
                    Vec_PtrPushUnique( vTimeFanins, pFanin2 );                    
        }
        // print the results
        if ( fVeryVerbose )
        {
        printf( "%5d Node %5d : %d %2d %2d  ", Counter, pNode->Id, 
            nTimeCris, Vec_PtrSize(vTimeCries), Vec_PtrSize(vTimeFanins) );
        Abc_ObjForEachFanin( pNode, pFanin, k )
            printf( "%d(%.2f)%s ", pFanin->Id, Abc_ObjSlack(pFanin), (puTCEdges[pNode->Id] & (1<<k))? "*":"" );
        printf( "\n" );
        }
        // add the node to choices
        if ( Vec_PtrSize(vTimeCries) == 0 || Vec_PtrSize(vTimeCries) > Degree )
            continue;
        // order the fanins in the increasing order of criticalily
        if ( Vec_PtrSize(vTimeCries) > 1 )
        {
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 0 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            {
                Vec_PtrWriteEntry( vTimeCries, 0, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin );
            }
        }
        if ( Vec_PtrSize(vTimeCries) > 2 )
        {
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 2 );
            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            {
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 2, pFanin );
            }
            pFanin = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 0 );
            pFanin2 = (Abc_Obj_t *)Vec_PtrEntry( vTimeCries, 1 );
            if ( Abc_ObjSlack(pFanin) < Abc_ObjSlack(pFanin2) )
            {
                Vec_PtrWriteEntry( vTimeCries, 0, pFanin2 );
                Vec_PtrWriteEntry( vTimeCries, 1, pFanin );
            }
        }
        // add choice
        Abc_NtkSpeedupNode( pNtk, pNtkNew, pNode, vTimeFanins, vTimeCries );
    }
    Vec_PtrFree( vTimeCries );
    Vec_PtrFree( vTimeFanins );
    ABC_FREE( puTCEdges );
    if ( fVerbose )
        printf( "Nodes: Total = %7d. 0-slack = %7d. Workable = %7d. Ratio = %4.2f\n", 
            Abc_NtkNodeNum(pNtk), Counter, CounterRes, 1.0*CounterRes/Counter ); 

    // remove invalid choice nodes
    Abc_AigForEachAnd( pNtkNew, pNode, i )
        if ( pNode->pData )
        {
            if ( Abc_ObjFanoutNum((Abc_Obj_t *)pNode->pData) > 0 )
                pNode->pData = NULL;
        }

    // return the result
    return pNtkNew;
}